

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::DiskSourceTreeTest_NoParent_Test::TestBody
          (DiskSourceTreeTest_NoParent_Test *this)

{
  char *pcVar1;
  pointer pMVar2;
  pointer pbVar3;
  Nonnull<const_char_*> failure_msg;
  char *contents;
  char *contents_00;
  string_view disk_path;
  undefined1 local_b8 [32];
  undefined1 local_98 [48];
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  LogMessageFatal local_38;
  
  pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._8_8_ = (pbVar3->_M_dataplus)._M_p;
  local_98._0_8_ = pbVar3->_M_string_length;
  local_68._0_8_ = &DAT_00000004;
  local_68._8_8_ = "/foo";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_b8,(lts_20250127 *)local_98,(AlphaNum *)local_68,
             (AlphaNum *)local_98._8_8_);
  DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_b8,(string *)"Hello World!",contents);
  pcVar1 = local_b8 + 0x10;
  if ((char *)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._8_8_ = (pbVar3->_M_dataplus)._M_p;
  local_98._0_8_ = pbVar3->_M_string_length;
  local_68._0_8_ = &DAT_00000004;
  local_68._8_8_ = "/bar";
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_b8,(lts_20250127 *)local_98,(AlphaNum *)local_68,
             (AlphaNum *)local_98._8_8_);
  File::CreateDir((File *)&local_38,(string *)local_b8,0x1ff);
  if ((StatusRep *)local_38.super_LogMessage._0_8_ == (StatusRep *)0x1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_38,
                             "File::CreateDir(dirname, 0777) is OK");
  }
  if ((local_38.super_LogMessage._0_8_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_38.super_LogMessage._0_8_);
  }
  if ((StatusRep *)local_38.super_LogMessage._0_8_ == (StatusRep *)0x1) {
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98._8_8_ = (pbVar3->_M_dataplus)._M_p;
    local_98._0_8_ = pbVar3->_M_string_length;
    local_68._0_8_ = &DAT_00000008;
    local_68._8_8_ = "/bar/baz";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b8,(lts_20250127 *)local_98,(AlphaNum *)local_68,
               (AlphaNum *)local_98._8_8_);
    DiskSourceTreeTest::AddFile((DiskSourceTreeTest *)local_b8,(string *)"Blah.",contents_00);
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    pbVar3 = (this->super_DiskSourceTreeTest).dirnames_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_98._8_8_ = (pbVar3->_M_dataplus)._M_p;
    local_98._0_8_ = pbVar3->_M_string_length;
    local_68._0_8_ = &DAT_00000004;
    local_68._8_8_ = "/bar";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_b8,(lts_20250127 *)local_98,(AlphaNum *)local_68,
               (AlphaNum *)local_98._8_8_);
    disk_path._M_str = (char *)local_b8._0_8_;
    disk_path._M_len = local_b8._8_8_;
    DiskSourceTree::MapPath
              (&(this->super_DiskSourceTreeTest).source_tree_,
               (string_view)(ZEXT816(0x1141ae9) << 0x40),disk_path);
    if ((char *)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
    pMVar2 = (pointer)(local_98 + 0x10);
    local_98._0_8_ = pMVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"baz","");
    DiskSourceTreeTest::ExpectFileContents
              (&this->super_DiskSourceTreeTest,(string *)local_98,"Blah.");
    if ((pointer)local_98._0_8_ != pMVar2) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    local_98._0_8_ = pMVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"../foo","");
    pbVar3 = (pointer)(local_68 + 0x10);
    local_68._0_8_ = pbVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,"");
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,(string *)local_98,(string *)local_68);
    if ((pointer)local_68._0_8_ != pbVar3) {
      operator_delete((void *)local_68._0_8_,(ulong)((long)local_58._M_dataplus._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != pMVar2) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    local_98._0_8_ = pMVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"../bar/baz","");
    local_68._0_8_ = pbVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,
               "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path"
               ,"");
    DiskSourceTreeTest::ExpectCannotOpenFile
              (&this->super_DiskSourceTreeTest,(string *)local_98,(string *)local_68);
    if ((pointer)local_68._0_8_ != pbVar3) {
      operator_delete((void *)local_68._0_8_,(ulong)((long)local_58._M_dataplus._M_p + 1));
    }
    if ((pointer)local_98._0_8_ != pMVar2) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/importer_unittest.cc"
             ,0x10a,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

TEST_F(DiskSourceTreeTest, NoParent) {
  // Test that we cannot open files in a parent of a mapped directory.

  AddFile(absl::StrCat(dirnames_[0], "/foo"), "Hello World!");
  AddSubdir(absl::StrCat(dirnames_[0], "/bar"));
  AddFile(absl::StrCat(dirnames_[0], "/bar/baz"), "Blah.");
  source_tree_.MapPath("", absl::StrCat(dirnames_[0], "/bar"));

  ExpectFileContents("baz", "Blah.");
  ExpectCannotOpenFile("../foo",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
  ExpectCannotOpenFile("../bar/baz",
                       "Backslashes, consecutive slashes, \".\", or \"..\" are "
                       "not allowed in the virtual path");
}